

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.hpp
# Opt level: O2

void __thiscall
duckdb::ParseTypeInfo::ParseTypeInfo(ParseTypeInfo *this,LogicalType *type,bool validate_utf_8_p)

{
  LogicalTypeId LVar1;
  
  this->validate_utf8 = validate_utf_8_p;
  LVar1 = type->id_;
  this->type_id = LVar1;
  this->internal_type = type->physical_type_;
  if (LVar1 == DECIMAL) {
    LogicalType::GetDecimalProperties(type,&this->width,&this->scale);
    return;
  }
  return;
}

Assistant:

ParseTypeInfo(const LogicalType &type, const bool validate_utf_8_p) : validate_utf8(validate_utf_8_p) {
		type_id = type.id();
		internal_type = type.InternalType();
		if (type.id() == LogicalTypeId::DECIMAL) {
			// We only care about these if we have a decimal value
			type.GetDecimalProperties(width, scale);
		}
	}